

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::ArrayStrideValidator::validateSingleVariable
          (ArrayStrideValidator *this,
          vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
          *path,string *resource,GLint propValue,string *implementationName)

{
  ostringstream *poVar1;
  pointer pVVar2;
  pointer pVVar3;
  TestContext *pTVar4;
  int iVar5;
  int iVar6;
  DataType DVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  undefined1 local_1b0 [16];
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  
  pVVar2 = (path->
           super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pVVar3 = (path->
           super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar8 = (long)pVVar3 - (long)pVVar2;
  if (pVVar2->m_type == TYPE_INTERFACEBLOCK) {
    bVar9 = ((pVVar2->m_data).block)->storage - STORAGE_UNIFORM < 2;
  }
  else {
    bVar9 = false;
  }
  if ((uVar8 < 0x11) || (*(int *)((long)pVVar2 + (uVar8 - 0x18)) != 0)) {
    DVar7 = ((pVVar3[-1].m_data.block)->layout).offset;
    bVar10 = true;
  }
  else {
    bVar10 = **(int **)((long)pVVar2 + (uVar8 - 0x20)) != 1;
    DVar7 = ((pVVar3[-1].m_data.block)->layout).offset;
    if ((!bVar10) && (bVar9 == true)) {
      iVar6 = glu::getDataTypeScalarSize(DVar7);
      DVar7 = glu::getDataTypeScalarType(((pVVar3[-1].m_data.block)->layout).offset);
      local_1b0._0_8_ = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log
      ;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Verifying array stride, expecting greater or equal to ",0x36);
      iVar6 = (uint)((DVar7 == TYPE_BOOL || DVar7 == TYPE_FLOAT) ||
                    (DVar7 & ~TYPE_FLOAT_VEC4) == TYPE_INT) * iVar6 * 4;
      std::ostream::operator<<(poVar1,iVar6);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      if (iVar6 <= propValue) {
        return;
      }
      local_1b0._0_8_ = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log
      ;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tError, got ",0xc);
      std::ostream::operator<<(poVar1,propValue);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      local_1b0._0_8_ = local_1a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,"resource array stride invalid","");
      pTVar4 = (this->super_SingleVariableValidator).super_PropValidator.m_testCtx;
      if (pTVar4->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(pTVar4,QP_TEST_RESULT_FAIL,(char *)local_1b0._0_8_);
      }
      goto LAB_0158e244;
    }
  }
  iVar5 = (byte)(bVar9 | DVar7 == TYPE_UINT_ATOMIC_COUNTER) - 1;
  iVar6 = 4;
  if (DVar7 != TYPE_UINT_ATOMIC_COUNTER) {
    iVar6 = iVar5;
  }
  if (bVar10) {
    iVar6 = iVar5;
  }
  local_1b0._0_8_ = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Verifying array stride, expecting ",0x22);
  std::ostream::operator<<(poVar1,iVar6);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  if (iVar6 == propValue) {
    return;
  }
  local_1b0._0_8_ = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tError, got ",0xc);
  std::ostream::operator<<(poVar1,propValue);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  local_1b0._0_8_ = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b0,"resource array stride invalid","");
  pTVar4 = (this->super_SingleVariableValidator).super_PropValidator.m_testCtx;
  if (pTVar4->m_testResult == QP_TEST_RESULT_PASS) {
    tcu::TestContext::setTestResult(pTVar4,QP_TEST_RESULT_FAIL,(char *)local_1b0._0_8_);
  }
LAB_0158e244:
  if ((TestLog *)local_1b0._0_8_ != local_1a0) {
    operator_delete((void *)local_1b0._0_8_,(ulong)((long)&(local_1a0[0].m_log)->flags + 1));
  }
  return;
}

Assistant:

void ArrayStrideValidator::validateSingleVariable (const std::vector<VariablePathComponent>& path, const std::string& resource, glw::GLint propValue, const std::string& implementationName) const
{
	const VariablePathComponent		nullComponent;
	const VariablePathComponent&	component			= path.back();
	const VariablePathComponent&	enclosingcomponent	= (path.size() > 1) ? (path[path.size()-2]) : (nullComponent);
	const VariablePathComponent&	firstComponent		= path.front();

	const bool						isBufferBlock		= firstComponent.isInterfaceBlock() && isBufferBackedInterfaceBlockStorage(firstComponent.getInterfaceBlock()->storage);
	const bool						isArray				= enclosingcomponent.isVariableType() && enclosingcomponent.getVariableType()->isArrayType();
	const bool						isAtomicCounter		= glu::isDataTypeAtomicCounter(component.getVariableType()->getBasicType()); // atomic counters are buffer backed with a stride of 4 basic machine units

	DE_UNREF(resource);
	DE_UNREF(implementationName);

	// Layout tests will verify layouts of buffer backed arrays properly. Here we just check values are greater or equal to the element size
	if (isBufferBlock && isArray)
	{
		const int elementSize = glu::getDataTypeScalarSize(component.getVariableType()->getBasicType()) * getTypeSize(glu::getDataTypeScalarType(component.getVariableType()->getBasicType()));
		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying array stride, expecting greater or equal to " << elementSize << tcu::TestLog::EndMessage;

		if (propValue < elementSize)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "\tError, got " << propValue << tcu::TestLog::EndMessage;
			setError("resource array stride invalid");
		}
	}
	else
	{
		// Atomics are buffer backed with stride of 4 even though they are not in an interface block
		const int arrayStride = (isAtomicCounter && isArray) ? (4) : (!isBufferBlock && !isAtomicCounter) ? (-1) : (0);

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying array stride, expecting " << arrayStride << tcu::TestLog::EndMessage;

		if (arrayStride != propValue)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "\tError, got " << propValue << tcu::TestLog::EndMessage;
			setError("resource array stride invalid");
		}
	}
}